

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::SeparateShaderTest::drawSurface
          (SeparateShaderTest *this,Surface *dst,deUint32 seed)

{
  GLenum err;
  deBool dVar1;
  RenderContext *ctx;
  TestLog *this_00;
  double __x;
  Rectangle RVar2;
  deUint32 local_64;
  undefined1 local_48 [8];
  Rectangle viewport;
  Random rnd;
  RenderContext *renderCtx;
  deUint32 seed_local;
  Surface *dst_local;
  SeparateShaderTest *this_local;
  
  ctx = getRenderContext(this);
  local_64 = seed;
  if (seed == 0) {
    local_64 = de::Random::getUint32(&this->m_rnd);
  }
  de::Random::Random((Random *)&viewport.width,local_64);
  RVar2 = randomViewport(ctx,(Random *)&viewport.width,0x80,0x80);
  viewport._0_8_ = RVar2._8_8_;
  local_48 = RVar2._0_8_;
  glu::CallLogWrapper::glClearColor(&this->super_CallLogWrapper,0.125,0.25,0.5,1.0);
  setViewport(ctx,(Rectangle *)local_48);
  glu::CallLogWrapper::glClear(&this->super_CallLogWrapper,0x4000);
  do {
    glu::CallLogWrapper::glDrawArrays(&this->super_CallLogWrapper,4,0,3);
    err = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
    glu::checkError(err,"glDrawArrays(GL_TRIANGLES, 0, 3)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSeparateShaderTests.cpp"
                    ,0x52a);
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  readRectangle(ctx,(Rectangle *)local_48,dst);
  log(this,__x);
  tcu::TestLog::writeMessage(this_00,"// Drew a triangle");
  de::Random::~Random((Random *)&viewport.width);
  return;
}

Assistant:

void SeparateShaderTest::drawSurface (Surface& dst, deUint32 seed)
{
	const RenderContext&	renderCtx	= getRenderContext();
	Random					rnd			(seed > 0 ? seed : m_rnd.getUint32());
	Rectangle				viewport	= randomViewport(renderCtx, rnd,
														 VIEWPORT_SIZE, VIEWPORT_SIZE);
	glClearColor(0.125f, 0.25f, 0.5f, 1.f);
	setViewport(renderCtx, viewport);
	glClear(GL_COLOR_BUFFER_BIT);
	GLU_CHECK_CALL(glDrawArrays(GL_TRIANGLES, 0, 3));
	readRectangle(renderCtx, viewport, dst);
	log().writeMessage("// Drew a triangle");
}